

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

uint64_t __thiscall
flatbuffers::BinaryAnnotator::BuildHeader(BinaryAnnotator *this,uint64_t header_offset)

{
  uint8_t *puVar1;
  int iVar2;
  Object *pOVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint64_t offset;
  ulong uVar8;
  uint64_t offset_00;
  bool bVar9;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegionComment root_offset_comment;
  BinaryRegionComment comment;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_428;
  BinaryRegionStatus local_410;
  undefined1 *local_408;
  long local_400;
  undefined1 local_3f8;
  undefined7 uStack_3f7;
  BinaryRegionCommentType local_3e8;
  undefined1 *local_3e0;
  long local_3d8;
  undefined1 local_3d0;
  undefined7 uStack_3cf;
  undefined1 *local_3c0;
  long local_3b8;
  undefined1 local_3b0;
  undefined7 uStack_3af;
  size_t local_3a0;
  uint64_t local_398;
  ulong local_390;
  undefined1 local_388 [40];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  ulong local_2e8;
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0 [2];
  long local_2b0 [2];
  string local_2a0;
  BinaryRegionCommentType local_278;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  undefined1 *local_250;
  long local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  size_t local_230;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  BinaryRegionCommentType local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  size_t local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  BinaryRegionCommentType local_188;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  size_t local_140;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  BinaryRegionCommentType local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  size_t local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  BinaryRegionCommentType local_98;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_t local_50;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offset_00 = header_offset;
  if (this->is_size_prefixed_ == true) {
    local_408 = &local_3f8;
    local_410 = OK;
    local_400 = 0;
    local_3f8 = 0;
    local_3e0 = &local_3d0;
    local_3d8 = 0;
    local_3d0 = 0;
    local_3b8 = 0;
    local_3b0 = 0;
    local_3a0 = 0;
    local_3e8 = SizePrefix;
    uVar5 = this->binary_length_;
    uVar6 = CONCAT71((int7)((ulong)local_3e0 >> 8),uVar5 < 9);
    if (header_offset + 7 < uVar5 && uVar5 >= 9) {
      uVar6 = *(ulong *)(this->binary_ + header_offset);
    }
    local_3c0 = &local_3b0;
    if (uVar5 < uVar6) {
      bVar9 = false;
    }
    else {
      local_138._0_4_ = OK;
      local_130._M_p = (pointer)&local_120;
      std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_408,local_408);
      local_110 = local_3e8;
      local_108._M_p = (pointer)&local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_3e0,local_3e0 + local_3d8);
      local_e8._M_p = (pointer)&local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_3c0,local_3c0 + local_3b8)
      ;
      local_c8 = local_3a0;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_388,header_offset,8,Uint64,0,0,
                 (BinaryRegionComment *)local_138);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_428,(BinaryRegion *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_p != &local_300) {
        operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != &local_320) {
        operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_348) {
        operator_delete(local_360.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_348._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
      offset_00 = header_offset + 8;
      bVar9 = true;
    }
    if (!bVar9) {
      uVar5 = this->binary_length_;
      if (offset_00 + 3 < uVar5 && 4 < uVar5) {
        uVar6 = (ulong)*(uint *)(this->binary_ + offset_00);
      }
      else {
        uVar6 = 0;
      }
      if (uVar6 <= uVar5) {
        local_228._0_4_ = local_410;
        local_220._M_p = (pointer)&local_210;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,local_408,local_408 + local_400);
        local_200 = local_3e8;
        local_1f8._M_p = (pointer)&local_1e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_3e0,local_3e0 + local_3d8);
        local_1d8._M_p = (pointer)&local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,local_3c0,local_3c0 + local_3b8);
        local_1b8 = local_3a0;
        anon_unknown_49::MakeBinaryRegion
                  ((BinaryRegion *)local_388,offset_00,4,Uint32,0,0,(BinaryRegionComment *)local_228
                  );
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&local_428,(BinaryRegion *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_p != &local_300) {
          operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != &local_320) {
          operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360.
               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
               ._M_impl.super__Vector_impl_data._M_finish != &local_348) {
          operator_delete(local_360.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          local_348._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_p != &local_1c8) {
          operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_p != &local_1e8) {
          operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_p != &local_210) {
          operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
        }
        offset_00 = offset_00 + 4;
        bVar9 = true;
      }
    }
    if (!bVar9) {
      local_2c0[0] = local_2b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"");
      local_410 = ERROR;
      std::__cxx11::string::_M_assign((string *)&local_408);
      if (local_2c0[0] != local_2b0) {
        operator_delete(local_2c0[0],local_2b0[0] + 1);
      }
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
    }
    if (local_3e0 != &local_3d0) {
      operator_delete(local_3e0,CONCAT71(uStack_3cf,local_3d0) + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,CONCAT71(uStack_3f7,local_3f8) + 1);
    }
  }
  uVar5 = this->binary_length_;
  if (uVar5 <= offset_00 + 3 || uVar5 < 5) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)*(uint *)(this->binary_ + offset_00);
  }
  uVar8 = 0xffffffffffffffff;
  if (offset_00 + 3 < uVar5 && uVar5 >= 5) {
    local_408 = &local_3f8;
    local_410 = OK;
    local_400 = 0;
    local_3f8 = 0;
    local_3e0 = &local_3d0;
    local_3d8 = 0;
    local_3d0 = 0;
    local_3c0 = &local_3b0;
    local_3b8 = 0;
    local_3b0 = 0;
    local_3a0 = 0;
    local_3e8 = RootTableOffset;
    pOVar3 = RootTable(this);
    if (*(ushort *)(pOVar3 + -(long)*(int *)pOVar3) < 5) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)(pOVar3 + (4 - (long)*(int *)pOVar3));
    }
    uVar5 = (ulong)uVar4;
    local_388._0_8_ = local_388 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,pOVar3 + *(uint *)(pOVar3 + uVar5) + uVar5 + 4,
               pOVar3 + (ulong)*(uint *)(pOVar3 + *(uint *)(pOVar3 + uVar5) + uVar5) +
                        *(uint *)(pOVar3 + uVar5) + uVar5 + 4);
    uVar6 = uVar6 + offset_00;
    std::__cxx11::string::operator=((string *)&local_3e0,(string *)local_388);
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    local_390 = uVar6;
    if (this->binary_length_ <= uVar6) {
      local_2e0[0] = local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"");
      local_410 = ERROR_OFFSET_OUT_OF_BINARY;
      std::__cxx11::string::_M_assign((string *)&local_408);
      if (local_2e0[0] != local_2d0) {
        operator_delete(local_2e0[0],local_2d0[0] + 1);
      }
    }
    local_c0._0_4_ = local_410;
    local_398 = header_offset;
    local_b8._M_p = (pointer)&local_a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_408,local_408 + local_400);
    local_98 = local_3e8;
    local_90._M_p = (pointer)&local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_3e0,local_3e0 + local_3d8);
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_3c0,local_3c0 + local_3b8);
    local_50 = local_3a0;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_388,offset_00,4,UOffset,0,local_390,
               (BinaryRegionComment *)local_c0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&local_428,(BinaryRegion *)local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_p != &local_300) {
      operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_348) {
      operator_delete(local_360.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_348._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    offset = local_398;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((4 < this->binary_length_) && (offset_00 + 7 < this->binary_length_)) {
      uVar5 = offset_00 + 4;
      bVar9 = 0xfffffffffffffffb < uVar5;
      if (!bVar9) {
        puVar1 = this->binary_;
        iVar2 = isprint((uint)puVar1[uVar5]);
        if (iVar2 != 0) {
          local_2e8 = offset_00 + 8;
          lVar7 = 3;
          uVar6 = offset_00 + 5;
          do {
            uVar8 = uVar6;
            bVar9 = lVar7 == 0;
            lVar7 = lVar7 + -1;
            if (bVar9) break;
            iVar2 = isprint((uint)puVar1[uVar8]);
            uVar6 = uVar8 + 1;
          } while (iVar2 != 0);
          bVar9 = local_2e8 <= uVar8;
          offset = local_398;
        }
      }
      if (bVar9) {
        local_2a0._M_string_length = (long)&local_2a0.field_2 + 8;
        local_2a0._M_dataplus._M_p = (pointer)((ulong)local_2a0._M_dataplus._M_p._4_4_ << 0x20);
        local_2a0.field_2._M_allocated_capacity = 0;
        local_2a0.field_2._M_local_buf[8] = '\0';
        local_270 = &local_260;
        local_268 = 0;
        local_260 = 0;
        local_248 = 0;
        local_240 = 0;
        local_230 = 0;
        local_278 = FileIdentifier;
        local_1b0._0_4_ = OK;
        local_1a8._M_p = (pointer)&local_198;
        local_250 = &local_240;
        std::__cxx11::string::_M_construct<char*>((string *)&local_1a8,local_2a0._M_string_length);
        local_188 = local_278;
        local_180._M_p = (pointer)&local_170;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,local_270,local_270 + local_268);
        local_160._M_p = (pointer)&local_150;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,local_250,local_250 + local_248);
        local_140 = local_230;
        anon_unknown_49::MakeBinaryRegion
                  ((BinaryRegion *)local_388,uVar5,4,Char,4,0,(BinaryRegionComment *)local_1b0);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&local_428,(BinaryRegion *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_p != &local_300) {
          operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != &local_320) {
          operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360.
               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
               ._M_impl.super__Vector_impl_data._M_finish != &local_348) {
          operator_delete(local_360.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          local_348._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_p != &local_150) {
          operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_p != &local_170) {
          operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_p != &local_198) {
          operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
        }
        if ((undefined1 *)local_2a0._M_string_length != (undefined1 *)((long)&local_2a0.field_2 + 8)
           ) {
          operator_delete((void *)local_2a0._M_string_length,
                          CONCAT71(local_2a0.field_2._9_7_,local_2a0.field_2._M_local_buf[8]) + 1);
        }
      }
    }
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_428.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_428.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_428.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_428.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_49::MakeBinarySection((BinarySection *)local_388,&local_2a0,Header,&local_48);
    AddSection(this,offset,(BinarySection *)local_388);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_360);
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_48);
    uVar8 = local_390;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
    }
    if (local_3e0 != &local_3d0) {
      operator_delete(local_3e0,CONCAT71(uStack_3cf,local_3d0) + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,CONCAT71(uStack_3f7,local_3f8) + 1);
    }
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_428);
  return uVar8;
}

Assistant:

uint64_t BinaryAnnotator::BuildHeader(const uint64_t header_offset) {
  uint64_t offset = header_offset;
  std::vector<BinaryRegion> regions;

  // If this binary is a size prefixed one, attempt to parse the size.
  if (is_size_prefixed_) {
    BinaryRegionComment prefix_length_comment;
    prefix_length_comment.type = BinaryRegionCommentType::SizePrefix;

    bool has_prefix_value = false;
    const auto prefix_length = ReadScalar<uoffset64_t>(offset);
    if (*prefix_length <= binary_length_) {
      regions.push_back(MakeBinaryRegion(offset, sizeof(uoffset64_t),
                                         BinaryRegionType::Uint64, 0, 0,
                                         prefix_length_comment));
      offset += sizeof(uoffset64_t);
      has_prefix_value = true;
    }

    if (!has_prefix_value) {
      const auto prefix_length = ReadScalar<uoffset_t>(offset);
      if (*prefix_length <= binary_length_) {
        regions.push_back(MakeBinaryRegion(offset, sizeof(uoffset_t),
                                           BinaryRegionType::Uint32, 0, 0,
                                           prefix_length_comment));
        offset += sizeof(uoffset_t);
        has_prefix_value = true;
      }
    }

    if (!has_prefix_value) {
      SetError(prefix_length_comment, BinaryRegionStatus::ERROR);
    }
  }

  const auto root_table_offset = ReadScalar<uint32_t>(offset);

  if (!root_table_offset.has_value()) {
    // This shouldn't occur, since we validate the min size of the buffer
    // before. But for completion sake, we shouldn't read passed the binary end.
    return std::numeric_limits<uint64_t>::max();
  }

  const auto root_table_loc = offset + *root_table_offset;

  BinaryRegionComment root_offset_comment;
  root_offset_comment.type = BinaryRegionCommentType::RootTableOffset;
  root_offset_comment.name = RootTable()->name()->str();

  if (!IsValidOffset(root_table_loc)) {
    SetError(root_offset_comment,
             BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
  }

  regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                     BinaryRegionType::UOffset, 0,
                                     root_table_loc, root_offset_comment));
  offset += sizeof(uint32_t);

  if (IsValidRead(offset, flatbuffers::kFileIdentifierLength) &&
      IsPrintableRegion(offset, flatbuffers::kFileIdentifierLength, binary_)) {
    BinaryRegionComment comment;
    comment.type = BinaryRegionCommentType::FileIdentifier;
    // Check if the file identifier region has non-zero data, and assume its
    // the file identifier. Otherwise, it will get filled in with padding
    // later.
    regions.push_back(MakeBinaryRegion(
        offset, flatbuffers::kFileIdentifierLength * sizeof(uint8_t),
        BinaryRegionType::Char, flatbuffers::kFileIdentifierLength, 0,
        comment));
  }

  AddSection(header_offset, MakeBinarySection("", BinarySectionType::Header,
                                              std::move(regions)));

  return root_table_loc;
}